

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-base.h
# Opt level: O2

string * __thiscall
mp::BasicSolver::GetOptionFile_abi_cxx11_
          (string *__return_storage_ptr__,BasicSolver *this,SolverOption *param_1)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->option_file_save_);
  return __return_storage_ptr__;
}

Assistant:

std::string GetOptionFile(const SolverOption &) const
  { return option_file_save_; }